

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
          (gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *this,double *blockA,double *_lhs,
          long lhsStride,long depth,long rows,long stride,long offset)

{
  bool bVar1;
  double *pdVar2;
  double (*padVar3) [2];
  Packet2d adVar4;
  long local_d8;
  long k_2;
  long i_1;
  long w;
  long k_1;
  Packet D;
  Packet C;
  Packet B;
  Packet A;
  long local_70;
  long k;
  long i;
  long peeled_mc;
  long count;
  const_blas_data_mapper<double,_long,_0> lhs;
  conj_if<false> cj;
  long rows_local;
  long depth_local;
  long lhsStride_local;
  double *_lhs_local;
  double *blockA_local;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *this_local;
  
  ignore_unused_variable<long>(&stride);
  ignore_unused_variable<long>(&offset);
  if ((stride != 0) || (bVar1 = true, offset != 0)) {
    bVar1 = false;
  }
  if (!bVar1) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hq-jiang[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x46d,
                  "void Eigen::internal::gemm_pack_lhs<double, long, 4, 2, 0>::operator()(Scalar *, const Scalar *__restrict, Index, Index, Index, Index, Index) [Scalar = double, Index = long, Pack1 = 4, Pack2 = 2, StorageOrder = 0, Conjugate = false, PanelMode = false]"
                 );
  }
  const_blas_data_mapper<double,_long,_0>::const_blas_data_mapper
            ((const_blas_data_mapper<double,_long,_0> *)&count,_lhs,lhsStride);
  peeled_mc = 0;
  i = (rows / 4) * 4;
  for (k = 0; k < i; k = k + 4) {
    for (local_70 = 0; local_70 < depth; local_70 = local_70 + 1) {
      pdVar2 = const_blas_data_mapper<double,_long,_0>::operator()
                         ((const_blas_data_mapper<double,_long,_0> *)&count,k,local_70);
      adVar4 = ploadu<double__vector(2)>(pdVar2);
      B[1] = adVar4[0];
      pdVar2 = const_blas_data_mapper<double,_long,_0>::operator()
                         ((const_blas_data_mapper<double,_long,_0> *)&count,k + 2,local_70);
      adVar4 = ploadu<double__vector(2)>(pdVar2);
      C[1] = adVar4[0];
      padVar3 = conj_if<false>::pconj<double__vector(2)>
                          ((conj_if<false> *)((long)&lhs.m_stride + 7),(double (*) [2])(B + 1));
      pstore<double,double__vector(2)>(blockA + peeled_mc,padVar3);
      padVar3 = conj_if<false>::pconj<double__vector(2)>
                          ((conj_if<false> *)((long)&lhs.m_stride + 7),(double (*) [2])(C + 1));
      pstore<double,double__vector(2)>(blockA + peeled_mc + 2,padVar3);
      peeled_mc = peeled_mc + 4;
    }
  }
  if (1 < rows % 4) {
    for (w = 0; w < depth; w = w + 1) {
      for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
        pdVar2 = const_blas_data_mapper<double,_long,_0>::operator()
                           ((const_blas_data_mapper<double,_long,_0> *)&count,i + i_1,w);
        pdVar2 = conj_if<false>::operator()((conj_if<false> *)((long)&lhs.m_stride + 7),pdVar2);
        blockA[peeled_mc] = *pdVar2;
        peeled_mc = peeled_mc + 1;
      }
    }
    i = i + 2;
  }
  for (k_2 = i; k_2 < rows; k_2 = k_2 + 1) {
    for (local_d8 = 0; local_d8 < depth; local_d8 = local_d8 + 1) {
      pdVar2 = const_blas_data_mapper<double,_long,_0>::operator()
                         ((const_blas_data_mapper<double,_long,_0> *)&count,k_2,local_d8);
      pdVar2 = conj_if<false>::operator()((conj_if<false> *)((long)&lhs.m_stride + 7),pdVar2);
      blockA[peeled_mc] = *pdVar2;
      peeled_mc = peeled_mc + 1;
    }
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, Pack1, Pack2, StorageOrder, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const Scalar* EIGEN_RESTRICT _lhs, Index lhsStride, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  eigen_assert( (StorageOrder==RowMajor) || ((Pack1%PacketSize)==0 && Pack1<=4*PacketSize) );
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  const_blas_data_mapper<Scalar, Index, StorageOrder> lhs(_lhs,lhsStride);
  Index count = 0;
  Index peeled_mc = (rows/Pack1)*Pack1;
  for(Index i=0; i<peeled_mc; i+=Pack1)
  {
    if(PanelMode) count += Pack1 * offset;

    if(StorageOrder==ColMajor)
    {
      for(Index k=0; k<depth; k++)
      {
        Packet A, B, C, D;
        if(Pack1>=1*PacketSize) A = ploadu<Packet>(&lhs(i+0*PacketSize, k));
        if(Pack1>=2*PacketSize) B = ploadu<Packet>(&lhs(i+1*PacketSize, k));
        if(Pack1>=3*PacketSize) C = ploadu<Packet>(&lhs(i+2*PacketSize, k));
        if(Pack1>=4*PacketSize) D = ploadu<Packet>(&lhs(i+3*PacketSize, k));
        if(Pack1>=1*PacketSize) { pstore(blockA+count, cj.pconj(A)); count+=PacketSize; }
        if(Pack1>=2*PacketSize) { pstore(blockA+count, cj.pconj(B)); count+=PacketSize; }
        if(Pack1>=3*PacketSize) { pstore(blockA+count, cj.pconj(C)); count+=PacketSize; }
        if(Pack1>=4*PacketSize) { pstore(blockA+count, cj.pconj(D)); count+=PacketSize; }
      }
    }
    else
    {
      for(Index k=0; k<depth; k++)
      {
        // TODO add a vectorized transpose here
        Index w=0;
        for(; w<Pack1-3; w+=4)
        {
          Scalar a(cj(lhs(i+w+0, k))),
                  b(cj(lhs(i+w+1, k))),
                  c(cj(lhs(i+w+2, k))),
                  d(cj(lhs(i+w+3, k)));
          blockA[count++] = a;
          blockA[count++] = b;
          blockA[count++] = c;
          blockA[count++] = d;
        }
        if(Pack1%4)
          for(;w<Pack1;++w)
            blockA[count++] = cj(lhs(i+w, k));
      }
    }
    if(PanelMode) count += Pack1 * (stride-offset-depth);
  }
  if(rows-peeled_mc>=Pack2)
  {
    if(PanelMode) count += Pack2*offset;
    for(Index k=0; k<depth; k++)
      for(Index w=0; w<Pack2; w++)
        blockA[count++] = cj(lhs(peeled_mc+w, k));
    if(PanelMode) count += Pack2 * (stride-offset-depth);
    peeled_mc += Pack2;
  }
  for(Index i=peeled_mc; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}